

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void list(string *rootDir)

{
  Image *image;
  undefined8 uVar1;
  ulong uVar2;
  undefined1 local_68 [8];
  string fileSize;
  undefined8 *local_40;
  
  printf("%4s  %20s  %10s  %30s\n","#","Image ID","Size","Last Modified");
  getContainerImages((vector<Image,_std::allocator<Image>_> *)((long)&fileSize.field_2 + 8),rootDir)
  ;
  uVar2 = 0;
  for (uVar1 = fileSize.field_2._8_8_; (undefined8 *)uVar1 != local_40; uVar1 = uVar1 + 0x48) {
    getHumanReadableFileSize_abi_cxx11_((string *)local_68,*(undefined8 *)(uVar1 + 0x20));
    printf("%4d  %20s  %10s  %30s\n",uVar2,*(undefined8 *)uVar1,local_68,
           *(undefined8 *)(uVar1 + 0x28));
    uVar2 = (ulong)((int)uVar2 + 1);
    std::__cxx11::string::~string((string *)local_68);
  }
  std::vector<Image,_std::allocator<Image>_>::~vector
            ((vector<Image,_std::allocator<Image>_> *)((long)&fileSize.field_2 + 8));
  return;
}

Assistant:

void list(const std::string& rootDir)
{
    printf("%4s  %20s  %10s  %30s\n", "#", "Image ID", "Size", "Last Modified");
    int count = 0;
    for (const auto& image : getContainerImages(rootDir))
    {
        std::string fileSize = getHumanReadableFileSize(image.fileSize);
        printf("%4d  %20s  %10s  %30s\n", count, image.id.c_str(), fileSize.c_str(), image.lastModified.c_str());
        count++;
    }
}